

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_crop.cpp
# Opt level: O1

Mat * IntArrayMat(Mat *__return_storage_ptr__,int a0,int a1)

{
  int *piVar1;
  int iVar2;
  void *ptr;
  void *local_28;
  
  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->c = 0;
  __return_storage_ptr__->cstep = 0;
  if ((((__return_storage_ptr__->dims != 1) || (__return_storage_ptr__->w != 2)) ||
      (__return_storage_ptr__->elemsize != 4)) ||
     ((__return_storage_ptr__->elempack != 1 ||
      (__return_storage_ptr__->allocator != (Allocator *)0x0)))) {
    piVar1 = __return_storage_ptr__->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (__return_storage_ptr__->allocator == (Allocator *)0x0) {
          if (__return_storage_ptr__->data != (void *)0x0) {
            free(__return_storage_ptr__->data);
          }
        }
        else {
          (**(code **)(*(long *)__return_storage_ptr__->allocator + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    __return_storage_ptr__->cstep = 0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->elemsize = 4;
    __return_storage_ptr__->elempack = 1;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 1;
    __return_storage_ptr__->w = 2;
    __return_storage_ptr__->h = 1;
    __return_storage_ptr__->c = 1;
    __return_storage_ptr__->cstep = 2;
    local_28 = (void *)0x0;
    iVar2 = posix_memalign(&local_28,0x10,0xc);
    if (iVar2 != 0) {
      local_28 = (void *)0x0;
    }
    __return_storage_ptr__->data = local_28;
    __return_storage_ptr__->refcount = (int *)((long)local_28 + 8);
    *(undefined4 *)((long)local_28 + 8) = 1;
  }
  piVar1 = (int *)__return_storage_ptr__->data;
  *piVar1 = a0;
  piVar1[1] = a1;
  return __return_storage_ptr__;
}

Assistant:

static ncnn::Mat IntArrayMat(int a0, int a1)
{
    ncnn::Mat m(2);
    int* p = m;
    p[0] = a0;
    p[1] = a1;
    return m;
}